

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::CommandLine(CommandLine<Catch::ConfigData> *this)

{
  IArgFunction<Catch::ConfigData> *_functionObj;
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  *in_RDI;
  
  _functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(8);
  memset(_functionObj,0,8);
  Detail::NullBinder<Catch::ConfigData>::NullBinder((NullBinder<Catch::ConfigData> *)in_RDI);
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            ((BoundArgFunction<Catch::ConfigData> *)in_RDI,_functionObj);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::vector((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
            *)0x1cab85);
  std::
  map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::map((map<int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
         *)0x1cab93);
  std::
  unique_ptr<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>>
  ::unique_ptr<std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>,void>(in_RDI);
  *(undefined4 *)
   &in_RDI[0xb]._M_t.
    super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
    ._M_t.
    super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
    .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>._M_head_impl
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[0xb]._M_t.
           super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
           _M_head_impl + 4) = 0;
  return;
}

Assistant:

CommandLine()
        :   m_boundProcessName( new Detail::NullBinder<ConfigT>() ),
            m_highestSpecifiedArgPosition( 0 ),
            m_throwOnUnrecognisedTokens( false )
        {}